

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O2

void __thiscall
btMultiBody::stepPositionsMultiDof::anon_struct_1_0_00000001::operator()
          (anon_struct_1_0_00000001 *this,btVector3 *omega,btQuaternion *quat,bool baseBody,
          btScalar dt)

{
  btVector3 *q2;
  btVector3 *q1;
  uint uVar1;
  btScalar bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  btQuaternion bVar7;
  ulong local_48;
  btVector3 local_38;
  btVector3 local_20;
  
  if ((int)quat == 0) {
    local_38 = quatRotate((btQuaternion *)omega,(btVector3 *)this);
  }
  else {
    local_38.m_floats = *(btScalar (*) [4])this;
  }
  bVar2 = btVector3::length(&local_38);
  uVar1 = -(uint)(0.7853982 < bVar2 * dt);
  fVar6 = (float)(~uVar1 & (uint)bVar2 | (uint)(0.7853982 / dt) & uVar1);
  if (0.001 <= fVar6) {
    fVar3 = sinf(fVar6 * 0.5 * dt);
    fVar3 = fVar3 / fVar6;
  }
  else {
    fVar3 = dt * 0.5 + dt * dt * dt * -0.020833334 * fVar6 * fVar6;
  }
  fVar5 = local_38.m_floats[0] * fVar3;
  fVar4 = fVar3 * local_38.m_floats[1];
  fVar3 = fVar3 * local_38.m_floats[2];
  if ((char)quat == '\0') {
    local_20.m_floats[3] = cosf(dt * fVar6 * 0.5);
    q1 = &local_20;
    q2 = omega;
    local_20.m_floats[0] = fVar5;
    local_20.m_floats[1] = fVar4;
    local_20.m_floats[2] = fVar3;
  }
  else {
    local_48 = CONCAT44(fVar4,fVar5) ^ 0x8000000080000000;
    local_20.m_floats[3] = cosf(dt * fVar6 * 0.5);
    local_20.m_floats[0] = (btScalar)local_48;
    local_20.m_floats[1] = (btScalar)(local_48 >> 0x20);
    q2 = &local_20;
    q1 = omega;
    local_20.m_floats[2] = -fVar3;
  }
  bVar7 = operator*((btQuaternion *)q1,(btQuaternion *)q2);
  *(btQuadWord *)omega->m_floats = bVar7.super_btQuadWord.m_floats;
  btQuaternion::normalize((btQuaternion *)omega);
  return;
}

Assistant:

void operator() (const btVector3 &omega, btQuaternion &quat, bool baseBody, btScalar dt)
		{
			//baseBody	=>	quat is alias and omega is global coor
			//!baseBody	=>	quat is alibi and omega is local coor	
			
			btVector3 axis;
			btVector3 angvel;

			if(!baseBody)			
				angvel = quatRotate(quat, omega);				//if quat is not m_baseQuat, it is alibi => ok			
			else
				angvel = omega;
		
			btScalar fAngle = angvel.length(); 		
			//limit the angular motion
			if (fAngle * dt > ANGULAR_MOTION_THRESHOLD)
			{
				fAngle = btScalar(0.5)*SIMD_HALF_PI / dt;
			}

			if ( fAngle < btScalar(0.001) )
			{
				// use Taylor's expansions of sync function
				axis   = angvel*( btScalar(0.5)*dt-(dt*dt*dt)*(btScalar(0.020833333333))*fAngle*fAngle );
			}
			else
			{
				// sync(fAngle) = sin(c*fAngle)/t
				axis   = angvel*( btSin(btScalar(0.5)*fAngle*dt)/fAngle );
			}
			
			if(!baseBody)				
				quat = btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat;			
			else			
				quat = quat * btQuaternion(-axis.x(),-axis.y(),-axis.z(),btCos( fAngle*dt*btScalar(0.5) ));
				//equivalent to: quat = (btQuaternion(axis.x(),axis.y(),axis.z(),btCos( fAngle*dt*btScalar(0.5) )) * quat.inverse()).inverse();			
		
			quat.normalize();
		}